

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void delay_move(_glist *x)

{
  t_editor *ptVar1;
  int dx;
  int dy;
  int iVar2;
  int iVar3;
  int iVar4;
  
  ptVar1 = x->gl_editor;
  iVar4 = ptVar1->e_xwas;
  iVar2 = ptVar1->e_ywas;
  iVar3 = x->gl_zoom;
  dx = (ptVar1->e_xnew - iVar4) / iVar3;
  dy = (ptVar1->e_ynew - iVar2) / iVar3;
  if (dx != 0 || dy != 0) {
    canvas_displaceselection(x,dx,dy);
    iVar3 = x->gl_zoom;
    ptVar1 = x->gl_editor;
    iVar4 = ptVar1->e_xwas;
    iVar2 = ptVar1->e_ywas;
  }
  ptVar1->e_xwas = dx * iVar3 + iVar4;
  ptVar1->e_ywas = dy * iVar3 + iVar2;
  return;
}

Assistant:

static void delay_move(t_canvas *x)
{
    int incx = (x->gl_editor->e_xnew - x->gl_editor->e_xwas)/x->gl_zoom,
        incy = (x->gl_editor->e_ynew - x->gl_editor->e_ywas)/x->gl_zoom;
    if (incx || incy)
        canvas_displaceselection(x, incx, incy);
    x->gl_editor->e_xwas += incx * x->gl_zoom;
    x->gl_editor->e_ywas += incy * x->gl_zoom;
}